

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# softmax.cpp
# Opt level: O3

int __thiscall ncnn::Softmax::forward_inplace(Softmax *this,Mat *bottom_top_blob,Option *opt)

{
  int *piVar1;
  size_t sVar2;
  size_t sVar3;
  size_t sVar4;
  undefined1 auVar5 [16];
  undefined8 uVar6;
  uint uVar7;
  uint uVar8;
  long lVar9;
  ulong uVar10;
  void *pvVar11;
  ulong uVar12;
  void *pvVar13;
  long lVar14;
  ulong uVar15;
  ulong uVar16;
  ulong uVar17;
  ulong uVar18;
  void *pvVar19;
  long lVar20;
  void *pvVar21;
  void *pvVar22;
  int remain;
  void *pvVar23;
  long lVar24;
  uint uVar25;
  int iVar26;
  int iVar27;
  float fVar28;
  float fVar29;
  int iVar33;
  undefined1 auVar30 [16];
  undefined1 auVar31 [16];
  undefined1 auVar32 [16];
  undefined1 auVar34 [16];
  undefined1 auVar35 [16];
  undefined1 auVar36 [16];
  undefined1 auVar37 [16];
  undefined1 auVar38 [16];
  undefined1 auVar39 [16];
  int iVar41;
  undefined1 auVar40 [16];
  size_t totalsize;
  Mat max;
  Mat sum;
  size_t totalsize_2;
  undefined1 local_d8 [16];
  undefined1 local_c8 [16];
  undefined1 local_b8 [16];
  void *local_a8;
  void *local_a0;
  undefined1 local_98 [16];
  undefined1 local_88 [16];
  undefined1 local_78 [16];
  void *local_68;
  void *local_58;
  void *local_50;
  long local_48;
  ulong local_40;
  int *local_38;
  
  uVar7 = bottom_top_blob->dims;
  if (uVar7 == 1) {
    iVar33 = bottom_top_blob->w;
    lVar14 = (long)iVar33;
    if (0 < lVar14) {
      pvVar23 = bottom_top_blob->data;
      fVar29 = -3.4028235e+38;
      lVar9 = 0;
      do {
        fVar28 = *(float *)((long)pvVar23 + lVar9 * 4);
        if (fVar29 <= fVar28) {
          fVar29 = fVar28;
        }
        lVar9 = lVar9 + 1;
      } while (lVar14 != lVar9);
      if (0 < iVar33) {
        lVar9 = 0;
        do {
          fVar28 = expf(*(float *)((long)pvVar23 + lVar9 * 4) - fVar29);
          *(float *)((long)pvVar23 + lVar9 * 4) = fVar28;
          lVar9 = lVar9 + 1;
        } while (lVar14 != lVar9);
        if (0 < iVar33) {
          fVar29 = 0.0;
          lVar9 = 0;
          do {
            fVar29 = fVar29 + *(float *)((long)pvVar23 + lVar9 * 4);
            lVar9 = lVar9 + 1;
          } while (lVar14 != lVar9);
          if (0 < iVar33) {
            lVar9 = 0;
            do {
              *(float *)((long)pvVar23 + lVar9 * 4) =
                   *(float *)((long)pvVar23 + lVar9 * 4) * (1.0 / fVar29);
              lVar9 = lVar9 + 1;
            } while (lVar14 != lVar9);
            return 0;
          }
        }
      }
    }
    return 0;
  }
  sVar2 = bottom_top_blob->elemsize;
  uVar25 = this->axis;
  if ((uVar7 ^ 2) == 0 && uVar25 == 0) {
    uVar7 = bottom_top_blob->w;
    pvVar23 = (void *)(long)(int)uVar7;
    uVar25 = bottom_top_blob->h;
    uVar16 = (ulong)uVar25;
    local_c8._8_8_ = opt->workspace_allocator;
    local_d8 = (undefined1  [16])0x0;
    local_c8._0_8_ = sVar2;
    local_b8._4_4_ = uVar7;
    local_b8._0_4_ = 1;
    local_b8._8_8_ = 0x100000001;
    if (pvVar23 == (void *)0x0) {
      return -100;
    }
    uVar15 = sVar2 * (long)pvVar23 + 3 & 0xfffffffffffffffc;
    local_a8 = pvVar23;
    if ((Allocator *)local_c8._8_8_ == (Allocator *)0x0) {
      pvVar11 = malloc(uVar15 + 0x1c);
      uVar10 = (long)pvVar11 + 0x17U & 0xfffffffffffffff0;
      *(void **)(uVar10 - 8) = pvVar11;
    }
    else {
      uVar10 = (*(code *)**(undefined8 **)local_c8._8_8_)();
    }
    uVar18 = (ulong)uVar7;
    local_d8._8_8_ = uVar10 + uVar15;
    local_d8._0_8_ = uVar10;
    *(undefined4 *)(uVar10 + uVar15) = 1;
    auVar5 = _DAT_0013a4c0;
    auVar34 = _DAT_0013a4b0;
    auVar35 = _DAT_0013a440;
    if (0 < (int)uVar7) {
      lVar14 = uVar18 - 1;
      auVar30._8_4_ = (int)lVar14;
      auVar30._0_8_ = lVar14;
      auVar30._12_4_ = (int)((ulong)lVar14 >> 0x20);
      uVar12 = 0;
      auVar30 = auVar30 ^ _DAT_0013a440;
      do {
        auVar36._8_4_ = (int)uVar12;
        auVar36._0_8_ = uVar12;
        auVar36._12_4_ = (int)(uVar12 >> 0x20);
        auVar40 = (auVar36 | auVar5) ^ auVar35;
        iVar33 = auVar30._4_4_;
        if ((bool)(~(auVar40._4_4_ == iVar33 && auVar30._0_4_ < auVar40._0_4_ ||
                    iVar33 < auVar40._4_4_) & 1)) {
          *(undefined4 *)(uVar10 + uVar12 * 4) = 0xff7fffff;
        }
        if ((auVar40._12_4_ != auVar30._12_4_ || auVar40._8_4_ <= auVar30._8_4_) &&
            auVar40._12_4_ <= auVar30._12_4_) {
          *(undefined4 *)(uVar10 + 4 + uVar12 * 4) = 0xff7fffff;
        }
        auVar40 = (auVar36 | auVar34) ^ auVar35;
        iVar27 = auVar40._4_4_;
        if (iVar27 <= iVar33 && (iVar27 != iVar33 || auVar40._0_4_ <= auVar30._0_4_)) {
          *(undefined4 *)(uVar10 + 8 + uVar12 * 4) = 0xff7fffff;
          *(undefined4 *)(uVar10 + 0xc + uVar12 * 4) = 0xff7fffff;
        }
        uVar12 = uVar12 + 4;
      } while ((uVar7 + 3 & 0xfffffffc) != uVar12);
    }
    if (0 < (int)uVar25) {
      pvVar11 = bottom_top_blob->data;
      iVar33 = bottom_top_blob->w;
      uVar12 = 0;
      do {
        if (0 < (int)uVar7) {
          uVar17 = 0;
          do {
            fVar28 = *(float *)((long)pvVar11 + uVar17 * 4);
            fVar29 = *(float *)(uVar10 + uVar17 * 4);
            if (fVar28 <= fVar29) {
              fVar28 = fVar29;
            }
            *(float *)(uVar10 + uVar17 * 4) = fVar28;
            uVar17 = uVar17 + 1;
          } while (uVar18 != uVar17);
        }
        uVar12 = uVar12 + 1;
        pvVar11 = (void *)((long)pvVar11 + (long)iVar33 * 4);
      } while (uVar12 != uVar16);
      if (0 < (int)uVar25) {
        pvVar11 = bottom_top_blob->data;
        iVar33 = bottom_top_blob->w;
        uVar12 = 0;
        do {
          if (0 < (int)uVar7) {
            uVar17 = 0;
            do {
              fVar29 = expf(*(float *)((long)pvVar11 + uVar17 * 4) - *(float *)(uVar10 + uVar17 * 4)
                           );
              *(float *)((long)pvVar11 + uVar17 * 4) = fVar29;
              uVar17 = uVar17 + 1;
            } while (uVar18 != uVar17);
          }
          uVar12 = uVar12 + 1;
          pvVar11 = (void *)((long)pvVar11 + (long)iVar33 * 4);
        } while (uVar12 != uVar16);
      }
    }
    local_88._8_8_ = opt->workspace_allocator;
    local_98 = (undefined1  [16])0x0;
    local_88._0_8_ = sVar2;
    local_78._4_4_ = uVar7;
    local_78._0_4_ = 1;
    local_78._8_8_ = 0x100000001;
    local_68 = pvVar23;
    if ((Allocator *)local_88._8_8_ == (Allocator *)0x0) {
      pvVar11 = malloc(uVar15 + 0x1c);
      pvVar23 = (void *)((long)pvVar11 + 0x17U & 0xfffffffffffffff0);
      *(void **)((long)pvVar23 - 8) = pvVar11;
    }
    else {
      pvVar23 = (void *)(*(code *)**(undefined8 **)local_88._8_8_)();
    }
    piVar1 = (int *)((long)pvVar23 + uVar15);
    local_98._8_8_ = piVar1;
    local_98._0_8_ = pvVar23;
    *(undefined4 *)((long)pvVar23 + uVar15) = 1;
    if (0 < (int)uVar7) {
      memset(pvVar23,0,uVar18 * 4);
    }
    if (0 < (int)uVar25) {
      pvVar11 = bottom_top_blob->data;
      iVar33 = bottom_top_blob->w;
      uVar15 = 0;
      do {
        if (0 < (int)uVar7) {
          uVar10 = 0;
          do {
            *(float *)((long)pvVar23 + uVar10 * 4) =
                 *(float *)((long)pvVar23 + uVar10 * 4) + *(float *)((long)pvVar11 + uVar10 * 4);
            uVar10 = uVar10 + 1;
          } while (uVar18 != uVar10);
        }
        uVar15 = uVar15 + 1;
        pvVar11 = (void *)((long)pvVar11 + (long)iVar33 * 4);
      } while (uVar15 != uVar16);
      if (0 < (int)uVar25) {
        pvVar11 = bottom_top_blob->data;
        iVar33 = bottom_top_blob->w;
        uVar15 = 0;
        do {
          if (0 < (int)uVar7) {
            uVar10 = 0;
            do {
              *(float *)((long)pvVar11 + uVar10 * 4) =
                   *(float *)((long)pvVar11 + uVar10 * 4) / *(float *)((long)pvVar23 + uVar10 * 4);
              uVar10 = uVar10 + 1;
            } while (uVar18 != uVar10);
          }
          uVar15 = uVar15 + 1;
          pvVar11 = (void *)((long)pvVar11 + (long)iVar33 * 4);
        } while (uVar15 != uVar16);
      }
    }
    LOCK();
    *piVar1 = *piVar1 + -1;
    UNLOCK();
    if (*piVar1 == 0) {
      if ((Allocator *)local_88._8_8_ == (Allocator *)0x0) {
        if ((void *)local_98._0_8_ != (void *)0x0) {
          free(*(void **)(local_98._0_8_ + -8));
        }
      }
      else {
        (**(code **)(*(long *)local_88._8_8_ + 8))();
      }
    }
    iVar26 = 0;
    if ((int *)local_d8._8_8_ == (int *)0x0) {
      return 0;
    }
    LOCK();
    *(int *)local_d8._8_8_ = *(int *)local_d8._8_8_ + -1;
    UNLOCK();
    if (*(int *)local_d8._8_8_ != 0) {
      return 0;
    }
    if ((Allocator *)local_c8._8_8_ != (Allocator *)0x0) {
      (**(code **)(*(long *)local_c8._8_8_ + 8))();
      return 0;
    }
  }
  else if ((uVar7 ^ 2) == 0 && (uVar25 ^ 1) == 0) {
    uVar7 = bottom_top_blob->w;
    uVar16 = (ulong)uVar7;
    iVar33 = bottom_top_blob->h;
    pvVar23 = (void *)(long)iVar33;
    local_c8._8_8_ = opt->workspace_allocator;
    local_d8 = ZEXT816(0);
    local_c8._0_8_ = sVar2;
    local_b8._4_4_ = iVar33;
    local_b8._0_4_ = 1;
    local_b8._8_8_ = 0x100000001;
    if (pvVar23 == (void *)0x0) {
      return -100;
    }
    uVar15 = sVar2 * (long)pvVar23 + 3 & 0xfffffffffffffffc;
    local_a8 = pvVar23;
    if ((Allocator *)local_c8._8_8_ == (Allocator *)0x0) {
      pvVar11 = malloc(uVar15 + 0x1c);
      uVar10 = (long)pvVar11 + 0x17U & 0xfffffffffffffff0;
      *(void **)(uVar10 - 8) = pvVar11;
    }
    else {
      uVar10 = (*(code *)**(undefined8 **)local_c8._8_8_)();
    }
    local_d8._8_8_ = uVar10 + uVar15;
    local_d8._0_8_ = uVar10;
    *(undefined4 *)(uVar10 + uVar15) = 1;
    if (0 < iVar33) {
      pvVar11 = bottom_top_blob->data;
      iVar27 = bottom_top_blob->w;
      pvVar13 = (void *)0x0;
      do {
        auVar34 = ZEXT816(0xff7fffff);
        if (0 < (int)uVar7) {
          uVar18 = 0;
          auVar34 = ZEXT816(0xff7fffff);
          do {
            fVar29 = *(float *)((long)pvVar11 + uVar18 * 4);
            if (auVar34._0_4_ <= fVar29) {
              auVar34._0_4_ = fVar29;
            }
            uVar18 = uVar18 + 1;
          } while (uVar16 != uVar18);
        }
        *(int *)(uVar10 + (long)pvVar13 * 4) = auVar34._0_4_;
        pvVar13 = (void *)((long)pvVar13 + 1);
        pvVar11 = (void *)((long)pvVar11 + (long)iVar27 * 4);
      } while (pvVar13 != pvVar23);
      if (0 < iVar33) {
        pvVar11 = bottom_top_blob->data;
        iVar27 = bottom_top_blob->w;
        pvVar13 = (void *)0x0;
        do {
          if (0 < (int)uVar7) {
            fVar29 = *(float *)(uVar10 + (long)pvVar13 * 4);
            uVar18 = 0;
            do {
              fVar28 = expf(*(float *)((long)pvVar11 + uVar18 * 4) - fVar29);
              *(float *)((long)pvVar11 + uVar18 * 4) = fVar28;
              uVar18 = uVar18 + 1;
            } while (uVar16 != uVar18);
          }
          pvVar13 = (void *)((long)pvVar13 + 1);
          pvVar11 = (void *)((long)pvVar11 + (long)iVar27 * 4);
        } while (pvVar13 != pvVar23);
      }
    }
    local_88._8_8_ = opt->workspace_allocator;
    local_98 = ZEXT816(0);
    local_88._0_8_ = sVar2;
    local_78._4_4_ = iVar33;
    local_78._0_4_ = 1;
    local_78._8_8_ = 0x100000001;
    local_68 = pvVar23;
    if ((Allocator *)local_88._8_8_ == (Allocator *)0x0) {
      pvVar11 = malloc(uVar15 + 0x1c);
      local_98._0_8_ = (long)pvVar11 + 0x17U & 0xfffffffffffffff0;
      *(void **)(local_98._0_8_ - 8) = pvVar11;
    }
    else {
      local_98._0_8_ = (*(code *)**(undefined8 **)local_88._8_8_)(local_88._8_8_,uVar15 + 4);
    }
    local_98._8_8_ = local_98._0_8_ + uVar15;
    *(undefined4 *)(local_98._0_8_ + uVar15) = 1;
    if (0 < iVar33) {
      pvVar11 = bottom_top_blob->data;
      iVar27 = bottom_top_blob->w;
      pvVar13 = (void *)0x0;
      do {
        fVar29 = 0.0;
        if (0 < (int)uVar7) {
          uVar15 = 0;
          do {
            fVar29 = fVar29 + *(float *)((long)pvVar11 + uVar15 * 4);
            uVar15 = uVar15 + 1;
          } while (uVar16 != uVar15);
        }
        *(float *)(local_98._0_8_ + (long)pvVar13 * 4) = fVar29;
        pvVar13 = (void *)((long)pvVar13 + 1);
        pvVar11 = (void *)((long)pvVar11 + (long)iVar27 * 4);
      } while (pvVar13 != pvVar23);
      if (0 < iVar33) {
        pvVar11 = bottom_top_blob->data;
        iVar33 = bottom_top_blob->w;
        pvVar13 = (void *)0x0;
        do {
          if (0 < (int)uVar7) {
            fVar29 = *(float *)(local_98._0_8_ + (long)pvVar13 * 4);
            uVar15 = 0;
            do {
              *(float *)((long)pvVar11 + uVar15 * 4) =
                   *(float *)((long)pvVar11 + uVar15 * 4) * (1.0 / fVar29);
              uVar15 = uVar15 + 1;
            } while (uVar16 != uVar15);
          }
          pvVar13 = (void *)((long)pvVar13 + 1);
          pvVar11 = (void *)((long)pvVar11 + (long)iVar33 * 4);
        } while (pvVar13 != pvVar23);
      }
    }
    LOCK();
    *(int *)local_98._8_8_ = *(int *)local_98._8_8_ + -1;
    UNLOCK();
    if (*(int *)local_98._8_8_ == 0) {
      if ((Allocator *)local_88._8_8_ == (Allocator *)0x0) {
        if (local_98._0_8_ != 0) {
          free(*(void **)(local_98._0_8_ - 8));
        }
      }
      else {
        (**(code **)(*(long *)local_88._8_8_ + 8))();
      }
    }
    iVar26 = 0;
    if ((int *)local_d8._8_8_ == (int *)0x0) {
      return 0;
    }
    LOCK();
    *(int *)local_d8._8_8_ = *(int *)local_d8._8_8_ + -1;
    UNLOCK();
    if (*(int *)local_d8._8_8_ != 0) {
      return 0;
    }
    if ((Allocator *)local_c8._8_8_ != (Allocator *)0x0) {
      (**(code **)(*(long *)local_c8._8_8_ + 8))();
      return 0;
    }
  }
  else {
    uVar7 = uVar7 ^ 3;
    if (uVar7 == 0 && uVar25 == 0) {
      iVar33 = bottom_top_blob->w;
      local_b8._8_4_ = bottom_top_blob->h;
      uVar7 = bottom_top_blob->c;
      uVar16 = (ulong)uVar7;
      uVar25 = local_b8._8_4_ * iVar33;
      uVar15 = (ulong)uVar25;
      local_c8._8_8_ = opt->workspace_allocator;
      local_d8 = (undefined1  [16])0x0;
      local_c8._0_8_ = sVar2;
      local_b8._4_4_ = iVar33;
      local_b8._0_4_ = 2;
      local_b8._12_4_ = 1;
      pvVar23 = (void *)(long)(int)uVar25;
      if (uVar25 == 0) {
        return -100;
      }
      local_a0 = (void *)CONCAT44(local_a0._4_4_,local_b8._8_4_);
      pvVar11 = (void *)(sVar2 * (long)pvVar23 + 3 & 0xfffffffffffffffc);
      local_a8 = pvVar23;
      if ((Allocator *)local_c8._8_8_ == (Allocator *)0x0) {
        pvVar13 = malloc((long)pvVar11 + 0x1c);
        uVar10 = (long)pvVar13 + 0x17U & 0xfffffffffffffff0;
        *(void **)(uVar10 - 8) = pvVar13;
      }
      else {
        uVar10 = (*(code *)**(undefined8 **)local_c8._8_8_)();
      }
      local_d8._8_8_ = uVar10 + (long)pvVar11;
      local_d8._0_8_ = uVar10;
      *(undefined4 *)(uVar10 + (long)pvVar11) = 1;
      auVar5 = _DAT_0013a4c0;
      auVar34 = _DAT_0013a4b0;
      auVar35 = _DAT_0013a440;
      if (0 < (int)uVar25) {
        lVar14 = (long)pvVar23 - 1;
        auVar31._8_4_ = (int)lVar14;
        auVar31._0_8_ = lVar14;
        auVar31._12_4_ = (int)((ulong)lVar14 >> 0x20);
        uVar18 = 0;
        auVar31 = auVar31 ^ _DAT_0013a440;
        do {
          auVar38._8_4_ = (int)uVar18;
          auVar38._0_8_ = uVar18;
          auVar38._12_4_ = (int)(uVar18 >> 0x20);
          auVar40 = (auVar38 | auVar5) ^ auVar35;
          iVar27 = auVar31._4_4_;
          if ((bool)(~(auVar40._4_4_ == iVar27 && auVar31._0_4_ < auVar40._0_4_ ||
                      iVar27 < auVar40._4_4_) & 1)) {
            *(undefined4 *)(uVar10 + uVar18 * 4) = 0xff7fffff;
          }
          if ((auVar40._12_4_ != auVar31._12_4_ || auVar40._8_4_ <= auVar31._8_4_) &&
              auVar40._12_4_ <= auVar31._12_4_) {
            *(undefined4 *)(uVar10 + 4 + uVar18 * 4) = 0xff7fffff;
          }
          auVar40 = (auVar38 | auVar34) ^ auVar35;
          iVar26 = auVar40._4_4_;
          if (iVar26 <= iVar27 && (iVar26 != iVar27 || auVar40._0_4_ <= auVar31._0_4_)) {
            *(undefined4 *)(uVar10 + 8 + uVar18 * 4) = 0xff7fffff;
            *(undefined4 *)(uVar10 + 0xc + uVar18 * 4) = 0xff7fffff;
          }
          uVar18 = uVar18 + 4;
        } while ((uVar25 + 3 & 0xfffffffc) != uVar18);
      }
      local_58 = pvVar11;
      local_50 = pvVar23;
      if (0 < (int)uVar7) {
        sVar3 = bottom_top_blob->cstep;
        sVar4 = bottom_top_blob->elemsize;
        pvVar23 = bottom_top_blob->data;
        uVar18 = 0;
        do {
          if (0 < (int)uVar25) {
            uVar12 = 0;
            do {
              fVar28 = *(float *)((long)pvVar23 + uVar12 * 4);
              fVar29 = *(float *)(uVar10 + uVar12 * 4);
              if (fVar28 <= fVar29) {
                fVar28 = fVar29;
              }
              *(float *)(uVar10 + uVar12 * 4) = fVar28;
              uVar12 = uVar12 + 1;
            } while (uVar15 != uVar12);
          }
          uVar18 = uVar18 + 1;
          pvVar23 = (void *)((long)pvVar23 + sVar3 * sVar4);
        } while (uVar18 != uVar16);
        if (0 < (int)uVar7) {
          pvVar23 = bottom_top_blob->data;
          sVar3 = bottom_top_blob->cstep;
          sVar4 = bottom_top_blob->elemsize;
          uVar18 = 0;
          do {
            if (0 < (int)uVar25) {
              uVar12 = 0;
              do {
                fVar29 = expf(*(float *)((long)pvVar23 + uVar12 * 4) -
                              *(float *)(uVar10 + uVar12 * 4));
                *(float *)((long)pvVar23 + uVar12 * 4) = fVar29;
                uVar12 = uVar12 + 1;
              } while (uVar15 != uVar12);
            }
            uVar18 = uVar18 + 1;
            pvVar23 = (void *)((long)pvVar23 + sVar3 * sVar4);
          } while (uVar18 != uVar16);
        }
      }
      pvVar11 = local_50;
      pvVar23 = local_58;
      local_88._8_8_ = opt->workspace_allocator;
      local_98 = (undefined1  [16])0x0;
      local_88._0_8_ = sVar2;
      local_78._4_4_ = iVar33;
      local_78._0_4_ = 2;
      local_78._8_4_ = local_a0._0_4_;
      local_78._12_4_ = 1;
      local_68 = local_50;
      if ((Allocator *)local_88._8_8_ == (Allocator *)0x0) {
        pvVar13 = malloc((long)local_58 + 0x1c);
        local_98._0_8_ = (long)pvVar13 + 0x17U & 0xfffffffffffffff0;
        *(void **)(local_98._0_8_ - 8) = pvVar13;
      }
      else {
        local_98._0_8_ = (*(code *)**(undefined8 **)local_88._8_8_)();
      }
      piVar1 = (int *)(local_98._0_8_ + (long)pvVar23);
      local_98._8_8_ = piVar1;
      *(undefined4 *)(local_98._0_8_ + (long)pvVar23) = 1;
      if (0 < (int)uVar25) {
        memset((void *)local_98._0_8_,0,(long)pvVar11 << 2);
      }
      if (0 < (int)uVar7) {
        sVar2 = bottom_top_blob->cstep;
        sVar3 = bottom_top_blob->elemsize;
        pvVar23 = bottom_top_blob->data;
        uVar10 = 0;
        do {
          if (0 < (int)uVar25) {
            uVar18 = 0;
            do {
              *(float *)(local_98._0_8_ + uVar18 * 4) =
                   *(float *)(local_98._0_8_ + uVar18 * 4) + *(float *)((long)pvVar23 + uVar18 * 4);
              uVar18 = uVar18 + 1;
            } while (uVar15 != uVar18);
          }
          uVar10 = uVar10 + 1;
          pvVar23 = (void *)((long)pvVar23 + sVar2 * sVar3);
        } while (uVar10 != uVar16);
        if (0 < (int)uVar7) {
          pvVar23 = bottom_top_blob->data;
          sVar2 = bottom_top_blob->cstep;
          sVar3 = bottom_top_blob->elemsize;
          uVar10 = 0;
          do {
            if (0 < (int)uVar25) {
              uVar18 = 0;
              do {
                *(float *)((long)pvVar23 + uVar18 * 4) =
                     *(float *)((long)pvVar23 + uVar18 * 4) /
                     *(float *)(local_98._0_8_ + uVar18 * 4);
                uVar18 = uVar18 + 1;
              } while (uVar15 != uVar18);
            }
            uVar10 = uVar10 + 1;
            pvVar23 = (void *)((long)pvVar23 + sVar2 * sVar3);
          } while (uVar10 != uVar16);
        }
      }
      LOCK();
      *piVar1 = *piVar1 + -1;
      UNLOCK();
      if (*piVar1 == 0) {
        if ((Allocator *)local_88._8_8_ == (Allocator *)0x0) {
          if ((void *)local_98._0_8_ != (void *)0x0) {
            free(*(void **)(local_98._0_8_ + -8));
          }
        }
        else {
          (**(code **)(*(long *)local_88._8_8_ + 8))();
        }
      }
      iVar26 = 0;
      if ((int *)local_d8._8_8_ == (int *)0x0) {
        return 0;
      }
      LOCK();
      *(int *)local_d8._8_8_ = *(int *)local_d8._8_8_ + -1;
      UNLOCK();
      if (*(int *)local_d8._8_8_ != 0) {
        return 0;
      }
      if ((Allocator *)local_c8._8_8_ != (Allocator *)0x0) {
        (**(code **)(*(long *)local_c8._8_8_ + 8))();
        return 0;
      }
    }
    else {
      if ((uVar25 ^ 1) != 0 || uVar7 != 0) {
        if (uVar7 != 0 || uVar25 != 2) {
          return 0;
        }
        uVar7 = bottom_top_blob->w;
        uVar16 = (ulong)uVar7;
        iVar33 = bottom_top_blob->h;
        uVar25 = bottom_top_blob->c;
        pvVar23 = (void *)(ulong)uVar25;
        local_b8 = (undefined1  [16])0x0;
        local_c8 = (undefined1  [16])0x0;
        local_d8 = (undefined1  [16])0x0;
        local_a8 = (void *)0x0;
        Mat::create((Mat *)local_d8,uVar7,uVar25,sVar2,opt->workspace_allocator);
        auVar5 = _DAT_0013a4c0;
        auVar34 = _DAT_0013a4b0;
        auVar35 = _DAT_0013a440;
        iVar27 = -100;
        if (((void *)local_d8._0_8_ != (void *)0x0) &&
           ((long)local_a8 * (long)(int)local_b8._12_4_ != 0)) {
          uVar8 = (int)local_a8 * local_b8._12_4_;
          if (0 < (int)uVar8) {
            lVar14 = (ulong)uVar8 - 1;
            auVar40._8_4_ = (int)lVar14;
            auVar40._0_8_ = lVar14;
            auVar40._12_4_ = (int)((ulong)lVar14 >> 0x20);
            uVar15 = 0;
            auVar40 = auVar40 ^ _DAT_0013a440;
            do {
              auVar37._8_4_ = (int)uVar15;
              auVar37._0_8_ = uVar15;
              auVar37._12_4_ = (int)(uVar15 >> 0x20);
              auVar32 = (auVar37 | auVar5) ^ auVar35;
              iVar27 = auVar40._4_4_;
              if ((bool)(~(auVar32._4_4_ == iVar27 && auVar40._0_4_ < auVar32._0_4_ ||
                          iVar27 < auVar32._4_4_) & 1)) {
                *(undefined4 *)(local_d8._0_8_ + uVar15 * 4) = 0xff7fffff;
              }
              if ((auVar32._12_4_ != auVar40._12_4_ || auVar32._8_4_ <= auVar40._8_4_) &&
                  auVar32._12_4_ <= auVar40._12_4_) {
                *(undefined4 *)(local_d8._0_8_ + uVar15 * 4 + 4) = 0xff7fffff;
              }
              auVar37 = (auVar37 | auVar34) ^ auVar35;
              iVar26 = auVar37._4_4_;
              if (iVar26 <= iVar27 && (iVar26 != iVar27 || auVar37._0_4_ <= auVar40._0_4_)) {
                *(undefined4 *)(local_d8._0_8_ + uVar15 * 4 + 8) = 0xff7fffff;
                *(undefined4 *)(local_d8._0_8_ + uVar15 * 4 + 0xc) = 0xff7fffff;
              }
              uVar15 = uVar15 + 4;
            } while ((uVar8 + 3 & 0xfffffffc) != uVar15);
          }
          if (0 < (int)uVar25) {
            pvVar11 = bottom_top_blob->data;
            sVar3 = bottom_top_blob->cstep;
            sVar4 = bottom_top_blob->elemsize;
            lVar14 = (long)(int)uVar7 * 4;
            pvVar19 = (void *)0x0;
            pvVar13 = (void *)local_d8._0_8_;
            do {
              if (0 < iVar33) {
                iVar27 = 0;
                pvVar21 = pvVar11;
                do {
                  if (0 < (int)uVar7) {
                    uVar15 = 0;
                    do {
                      fVar28 = *(float *)((long)pvVar21 + uVar15 * 4);
                      fVar29 = *(float *)((long)pvVar13 + uVar15 * 4);
                      if (fVar28 <= fVar29) {
                        fVar28 = fVar29;
                      }
                      *(float *)((long)pvVar13 + uVar15 * 4) = fVar28;
                      uVar15 = uVar15 + 1;
                    } while (uVar16 != uVar15);
                  }
                  iVar27 = iVar27 + 1;
                  pvVar21 = (void *)((long)pvVar21 + lVar14);
                } while (iVar27 != iVar33);
              }
              pvVar19 = (void *)((long)pvVar19 + 1);
              pvVar11 = (void *)((long)pvVar11 + sVar3 * sVar4);
              pvVar13 = (void *)((long)pvVar13 + (long)(int)local_b8._4_4_ * 4);
            } while (pvVar19 != pvVar23);
            if (0 < (int)uVar25) {
              local_a0 = bottom_top_blob->data;
              local_48 = (long)(int)local_b8._4_4_ << 2;
              local_58 = (void *)(bottom_top_blob->cstep * bottom_top_blob->elemsize);
              pvVar13 = (void *)0x0;
              pvVar11 = (void *)local_d8._0_8_;
              local_50 = pvVar23;
              do {
                if (0 < iVar33) {
                  iVar27 = 0;
                  pvVar23 = local_a0;
                  do {
                    if (0 < (int)uVar7) {
                      uVar15 = 0;
                      do {
                        fVar29 = expf(*(float *)((long)pvVar23 + uVar15 * 4) -
                                      *(float *)((long)pvVar11 + uVar15 * 4));
                        *(float *)((long)pvVar23 + uVar15 * 4) = fVar29;
                        uVar15 = uVar15 + 1;
                      } while (uVar16 != uVar15);
                    }
                    iVar27 = iVar27 + 1;
                    pvVar23 = (void *)((long)pvVar23 + lVar14);
                  } while (iVar27 != iVar33);
                }
                pvVar13 = (void *)((long)pvVar13 + 1);
                pvVar11 = (void *)((long)pvVar11 + local_48);
                local_a0 = (void *)((long)local_a0 + (long)local_58);
                pvVar23 = local_50;
              } while (pvVar13 != local_50);
            }
          }
          local_78 = (undefined1  [16])0x0;
          local_88 = (undefined1  [16])0x0;
          local_98 = (undefined1  [16])0x0;
          local_68 = (void *)0x0;
          iVar26 = (int)pvVar23;
          Mat::create((Mat *)local_98,uVar7,iVar26,sVar2,opt->workspace_allocator);
          pvVar11 = (void *)local_98._0_8_;
          iVar27 = -100;
          if (((void *)local_98._0_8_ != (void *)0x0) &&
             ((long)local_68 * (long)(int)local_78._12_4_ != 0)) {
            uVar25 = (int)local_68 * local_78._12_4_;
            if (0 < (int)uVar25) {
              memset((void *)local_98._0_8_,0,(ulong)uVar25 << 2);
            }
            if (0 < iVar26) {
              pvVar13 = bottom_top_blob->data;
              sVar2 = bottom_top_blob->cstep;
              sVar3 = bottom_top_blob->elemsize;
              lVar14 = (long)(int)uVar7 * 4;
              pvVar21 = (void *)0x0;
              pvVar19 = pvVar11;
              do {
                if (0 < iVar33) {
                  iVar27 = 0;
                  pvVar22 = pvVar13;
                  do {
                    if (0 < (int)uVar7) {
                      uVar15 = 0;
                      do {
                        *(float *)((long)pvVar19 + uVar15 * 4) =
                             *(float *)((long)pvVar19 + uVar15 * 4) +
                             *(float *)((long)pvVar22 + uVar15 * 4);
                        uVar15 = uVar15 + 1;
                      } while (uVar16 != uVar15);
                    }
                    iVar27 = iVar27 + 1;
                    pvVar22 = (void *)((long)pvVar22 + lVar14);
                  } while (iVar27 != iVar33);
                }
                pvVar21 = (void *)((long)pvVar21 + 1);
                pvVar19 = (void *)((long)pvVar19 + (long)(int)local_78._4_4_ * 4);
                pvVar13 = (void *)((long)pvVar13 + sVar2 * sVar3);
              } while (pvVar21 != pvVar23);
              if (0 < iVar26) {
                pvVar13 = bottom_top_blob->data;
                sVar2 = bottom_top_blob->cstep;
                sVar3 = bottom_top_blob->elemsize;
                pvVar19 = (void *)0x0;
                do {
                  if (0 < iVar33) {
                    iVar27 = 0;
                    pvVar21 = pvVar13;
                    do {
                      if (0 < (int)uVar7) {
                        uVar15 = 0;
                        do {
                          *(float *)((long)pvVar21 + uVar15 * 4) =
                               *(float *)((long)pvVar21 + uVar15 * 4) /
                               *(float *)((long)pvVar11 + uVar15 * 4);
                          uVar15 = uVar15 + 1;
                        } while (uVar16 != uVar15);
                      }
                      iVar27 = iVar27 + 1;
                      pvVar21 = (void *)((long)pvVar21 + lVar14);
                    } while (iVar27 != iVar33);
                  }
                  pvVar19 = (void *)((long)pvVar19 + 1);
                  pvVar13 = (void *)((long)pvVar13 + sVar2 * sVar3);
                  pvVar11 = (void *)((long)pvVar11 + (long)(int)local_78._4_4_ * 4);
                } while (pvVar19 != pvVar23);
              }
            }
            iVar27 = 0;
          }
          Mat::~Mat((Mat *)local_98);
        }
        Mat::~Mat((Mat *)local_d8);
        return iVar27;
      }
      uVar7 = bottom_top_blob->w;
      uVar16 = (ulong)uVar7;
      uVar25 = bottom_top_blob->c;
      pvVar23 = (void *)(ulong)uVar25;
      iVar33 = bottom_top_blob->h;
      lVar14 = (long)iVar33;
      local_c8._8_8_ = opt->workspace_allocator;
      local_d8 = (undefined1  [16])0x0;
      local_c8._0_8_ = sVar2;
      local_b8._4_4_ = iVar33;
      local_b8._0_4_ = 2;
      local_b8._8_4_ = uVar25;
      local_b8._12_4_ = 1;
      iVar27 = uVar25 * iVar33;
      pvVar11 = (void *)(long)iVar27;
      if (iVar27 == 0) {
        return -100;
      }
      uVar15 = sVar2 * (long)pvVar11 + 3 & 0xfffffffffffffffc;
      local_a8 = pvVar11;
      if ((Allocator *)local_c8._8_8_ == (Allocator *)0x0) {
        pvVar13 = malloc(uVar15 + 0x1c);
        local_40 = (long)pvVar13 + 0x17U & 0xfffffffffffffff0;
        *(void **)(local_40 - 8) = pvVar13;
      }
      else {
        local_40 = (*(code *)**(undefined8 **)local_c8._8_8_)(local_c8._8_8_,uVar15 + 4);
      }
      local_38 = (int *)(local_40 + uVar15);
      local_d8._8_8_ = local_38;
      local_d8._0_8_ = local_40;
      *(undefined4 *)(local_40 + uVar15) = 1;
      auVar5 = _DAT_0013a4c0;
      auVar34 = _DAT_0013a4b0;
      auVar35 = _DAT_0013a440;
      if (0 < iVar27) {
        lVar9 = (long)pvVar11 - 1;
        auVar32._8_4_ = (int)lVar9;
        auVar32._0_8_ = lVar9;
        auVar32._12_4_ = (int)((ulong)lVar9 >> 0x20);
        uVar15 = 0;
        auVar32 = auVar32 ^ _DAT_0013a440;
        do {
          auVar39._8_4_ = (int)uVar15;
          auVar39._0_8_ = uVar15;
          auVar39._12_4_ = (int)(uVar15 >> 0x20);
          auVar40 = (auVar39 | auVar5) ^ auVar35;
          iVar26 = auVar32._4_4_;
          if ((bool)(~(auVar40._4_4_ == iVar26 && auVar32._0_4_ < auVar40._0_4_ ||
                      iVar26 < auVar40._4_4_) & 1)) {
            *(undefined4 *)(local_40 + uVar15 * 4) = 0xff7fffff;
          }
          if ((auVar40._12_4_ != auVar32._12_4_ || auVar40._8_4_ <= auVar32._8_4_) &&
              auVar40._12_4_ <= auVar32._12_4_) {
            *(undefined4 *)(local_40 + 4 + uVar15 * 4) = 0xff7fffff;
          }
          auVar40 = (auVar39 | auVar34) ^ auVar35;
          iVar41 = auVar40._4_4_;
          if (iVar41 <= iVar26 && (iVar41 != iVar26 || auVar40._0_4_ <= auVar32._0_4_)) {
            *(undefined4 *)(local_40 + 8 + uVar15 * 4) = 0xff7fffff;
            *(undefined4 *)(local_40 + 0xc + uVar15 * 4) = 0xff7fffff;
          }
          uVar15 = uVar15 + 4;
        } while ((iVar27 + 3U & 0xfffffffc) != uVar15);
      }
      if (0 < (int)uVar25) {
        sVar3 = bottom_top_blob->cstep;
        sVar4 = bottom_top_blob->elemsize;
        pvVar11 = bottom_top_blob->data;
        lVar9 = (long)(int)uVar7 * 4;
        pvVar13 = (void *)0x0;
        do {
          if (0 < iVar33) {
            lVar20 = 0;
            pvVar19 = pvVar11;
            do {
              auVar35 = ZEXT816(0xff7fffff);
              if (0 < (int)uVar7) {
                uVar15 = 0;
                auVar35 = ZEXT816(0xff7fffff);
                do {
                  fVar29 = *(float *)((long)pvVar19 + uVar15 * 4);
                  if (auVar35._0_4_ <= fVar29) {
                    auVar35._0_4_ = fVar29;
                  }
                  uVar15 = uVar15 + 1;
                } while (uVar16 != uVar15);
              }
              *(int *)(local_40 + (long)pvVar13 * lVar14 * 4 + lVar20 * 4) = auVar35._0_4_;
              lVar20 = lVar20 + 1;
              pvVar19 = (void *)((long)pvVar19 + lVar9);
            } while (lVar20 != lVar14);
          }
          pvVar13 = (void *)((long)pvVar13 + 1);
          pvVar11 = (void *)((long)pvVar11 + sVar3 * sVar4);
        } while (pvVar13 != pvVar23);
        if (0 < (int)uVar25) {
          local_50 = bottom_top_blob->data;
          local_48 = bottom_top_blob->cstep * bottom_top_blob->elemsize;
          local_a0 = (void *)0x0;
          local_58 = pvVar23;
          do {
            if (0 < iVar33) {
              lVar20 = local_40 + (long)local_a0 * lVar14 * 4;
              lVar24 = 0;
              pvVar23 = local_50;
              do {
                if (0 < (int)uVar7) {
                  fVar29 = *(float *)(lVar20 + lVar24 * 4);
                  uVar15 = 0;
                  do {
                    fVar28 = expf(*(float *)((long)pvVar23 + uVar15 * 4) - fVar29);
                    *(float *)((long)pvVar23 + uVar15 * 4) = fVar28;
                    uVar15 = uVar15 + 1;
                  } while (uVar16 != uVar15);
                }
                lVar24 = lVar24 + 1;
                pvVar23 = (void *)((long)pvVar23 + lVar9);
              } while (lVar24 != lVar14);
            }
            local_a0 = (void *)((long)local_a0 + 1);
            local_50 = (void *)((long)local_50 + local_48);
            pvVar23 = local_58;
          } while (local_a0 != local_58);
        }
      }
      local_78 = (undefined1  [16])0x0;
      local_88 = (undefined1  [16])0x0;
      local_98 = (undefined1  [16])0x0;
      local_68 = (void *)0x0;
      iVar27 = (int)pvVar23;
      Mat::create((Mat *)local_98,iVar33,iVar27,sVar2,opt->workspace_allocator);
      uVar6 = local_98._0_8_;
      iVar26 = -100;
      if (((void *)local_98._0_8_ != (void *)0x0) &&
         ((long)local_68 * (long)(int)local_78._12_4_ != 0)) {
        uVar25 = (int)local_68 * local_78._12_4_;
        if (0 < (int)uVar25) {
          memset((void *)local_98._0_8_,0,(ulong)uVar25 << 2);
        }
        if (0 < iVar27) {
          pvVar11 = bottom_top_blob->data;
          sVar2 = bottom_top_blob->cstep;
          sVar3 = bottom_top_blob->elemsize;
          lVar9 = (long)(int)uVar7 * 4;
          pvVar13 = (void *)0x0;
          do {
            if (0 < iVar33) {
              lVar20 = 0;
              pvVar19 = pvVar11;
              do {
                fVar29 = 0.0;
                if (0 < (int)uVar7) {
                  uVar15 = 0;
                  do {
                    fVar29 = fVar29 + *(float *)((long)pvVar19 + uVar15 * 4);
                    uVar15 = uVar15 + 1;
                  } while (uVar16 != uVar15);
                }
                *(float *)(uVar6 + lVar20 * 4 + (long)pvVar13 * (long)(int)local_78._4_4_ * 4) =
                     fVar29;
                lVar20 = lVar20 + 1;
                pvVar19 = (void *)((long)pvVar19 + lVar9);
              } while (lVar20 != lVar14);
            }
            pvVar13 = (void *)((long)pvVar13 + 1);
            pvVar11 = (void *)((long)pvVar11 + sVar2 * sVar3);
          } while (pvVar13 != pvVar23);
          if (0 < iVar27) {
            pvVar11 = bottom_top_blob->data;
            sVar2 = bottom_top_blob->cstep;
            sVar3 = bottom_top_blob->elemsize;
            pvVar13 = (void *)0x0;
            do {
              if (0 < iVar33) {
                lVar20 = 0;
                pvVar19 = pvVar11;
                do {
                  if (0 < (int)uVar7) {
                    fVar29 = *(float *)(uVar6 + lVar20 * 4 +
                                                (long)pvVar13 * (long)(int)local_78._4_4_ * 4);
                    uVar15 = 0;
                    do {
                      *(float *)((long)pvVar19 + uVar15 * 4) =
                           *(float *)((long)pvVar19 + uVar15 * 4) * (1.0 / fVar29);
                      uVar15 = uVar15 + 1;
                    } while (uVar16 != uVar15);
                  }
                  lVar20 = lVar20 + 1;
                  pvVar19 = (void *)((long)pvVar19 + lVar9);
                } while (lVar20 != lVar14);
              }
              pvVar13 = (void *)((long)pvVar13 + 1);
              pvVar11 = (void *)((long)pvVar11 + sVar2 * sVar3);
            } while (pvVar13 != pvVar23);
          }
        }
        iVar26 = 0;
      }
      Mat::~Mat((Mat *)local_98);
      LOCK();
      *local_38 = *local_38 + -1;
      UNLOCK();
      if (*local_38 != 0) {
        return iVar26;
      }
      if ((Allocator *)local_c8._8_8_ != (Allocator *)0x0) {
        (**(code **)(*(long *)local_c8._8_8_ + 8))();
        return iVar26;
      }
    }
  }
  if ((void *)local_d8._0_8_ != (void *)0x0) {
    free(*(void **)(local_d8._0_8_ + -8));
  }
  return iVar26;
}

Assistant:

int Softmax::forward_inplace(Mat& bottom_top_blob, const Option& opt) const
{
    // value = exp( value - global max value )
    // sum all value
    // value = value / sum

    int dims = bottom_top_blob.dims;
    size_t elemsize = bottom_top_blob.elemsize;

    if (dims == 1) // axis == 0
    {
        int w = bottom_top_blob.w;

        float* ptr = bottom_top_blob;

        float max = -FLT_MAX;
        for (int i=0; i<w; i++)
        {
            max = std::max(max, ptr[i]);
        }

        for (int i=0; i<w; i++)
        {
            ptr[i] = exp(ptr[i] - max);
        }

        float sum = 0.f;
        for (int i=0; i<w; i++)
        {
            sum += ptr[i];
        }

        for (int i=0; i<w; i++)
        {
            ptr[i] /= sum;
        }

        return 0;
    }

    if (dims == 2 && axis == 0)
    {
        int w = bottom_top_blob.w;
        int h = bottom_top_blob.h;

        Mat max;
        max.create(w, elemsize, opt.workspace_allocator);
        if (max.empty())
            return -100;
        max.fill(-FLT_MAX);

        for (int i=0; i<h; i++)
        {
            const float* ptr = bottom_top_blob.row(i);
            for (int j=0; j<w; j++)
            {
                max[j] = std::max(max[j], ptr[j]);
            }
        }

        for (int i=0; i<h; i++)
        {
            float* ptr = bottom_top_blob.row(i);
            for (int j=0; j<w; j++)
            {
                ptr[j] = exp(ptr[j] - max[j]);
            }
        }

        Mat sum;
        sum.create(w, elemsize, opt.workspace_allocator);
        if (sum.empty())
            return -100;
        sum.fill(0.f);

        for (int i=0; i<h; i++)
        {
            const float* ptr = bottom_top_blob.row(i);
            for (int j=0; j<w; j++)
            {
                sum[j] += ptr[j];
            }
        }

        for (int i=0; i<h; i++)
        {
            float* ptr = bottom_top_blob.row(i);
            for (int j=0; j<w; j++)
            {
                ptr[j] /= sum[j];
            }
        }

        return 0;
    }

    if (dims == 2 && axis == 1)
    {
        int w = bottom_top_blob.w;
        int h = bottom_top_blob.h;

        Mat max;
        max.create(h, elemsize, opt.workspace_allocator);
        if (max.empty())
            return -100;

        for (int i=0; i<h; i++)
        {
            const float* ptr = bottom_top_blob.row(i);

            float m = -FLT_MAX;
            for (int j=0; j<w; j++)
            {
                m = std::max(m, ptr[j]);
            }

            max[i] = m;
        }

        for (int i=0; i<h; i++)
        {
            float* ptr = bottom_top_blob.row(i);

            float m = max[i];
            for (int j=0; j<w; j++)
            {
                ptr[j] = exp(ptr[j] - m);
            }
        }

        Mat sum;
        sum.create(h, elemsize, opt.workspace_allocator);
        if (sum.empty())
            return -100;

        for (int i=0; i<h; i++)
        {
            const float* ptr = bottom_top_blob.row(i);

            float s = 0.f;
            for (int j=0; j<w; j++)
            {
                s += ptr[j];
            }

            sum[i] = s;
        }

        for (int i=0; i<h; i++)
        {
            float* ptr = bottom_top_blob.row(i);

            float s = sum[i];
            for (int j=0; j<w; j++)
            {
                ptr[j] /= s;
            }
        }

        return 0;
    }

    if (dims == 3 && axis == 0)
    {
        int w = bottom_top_blob.w;
        int h = bottom_top_blob.h;
        int channels = bottom_top_blob.c;
        int size = w * h;

        Mat max;
        max.create(w, h, elemsize, opt.workspace_allocator);
        if (max.empty())
            return -100;
        max.fill(-FLT_MAX);
        for (int q=0; q<channels; q++)
        {
            const float* ptr = bottom_top_blob.channel(q);

            for (int i=0; i<size; i++)
            {
                max[i] = std::max(max[i], ptr[i]);
            }
        }

        #pragma omp parallel for num_threads(opt.num_threads)
        for (int q=0; q<channels; q++)
        {
            float* ptr = bottom_top_blob.channel(q);

            for (int i=0; i<size; i++)
            {
                ptr[i] = exp(ptr[i] - max[i]);
            }
        }

        Mat sum;
        sum.create(w, h, elemsize, opt.workspace_allocator);
        if (sum.empty())
            return -100;
        sum.fill(0.f);
        for (int q=0; q<channels; q++)
        {
            const float* ptr = bottom_top_blob.channel(q);

            for (int i=0; i<size; i++)
            {
                sum[i] += ptr[i];
            }
        }

        #pragma omp parallel for num_threads(opt.num_threads)
        for (int q=0; q<channels; q++)
        {
            float* ptr = bottom_top_blob.channel(q);

            for (int i=0; i<size; i++)
            {
                ptr[i] /= sum[i];
            }
        }

        return 0;
    }

    if (dims == 3 && axis == 1)
    {
        int w = bottom_top_blob.w;
        int h = bottom_top_blob.h;
        int channels = bottom_top_blob.c;

        Mat max;
        max.create(h, channels, elemsize, opt.workspace_allocator);
        if (max.empty())
            return -100;
        max.fill(-FLT_MAX);
        #pragma omp parallel for num_threads(opt.num_threads)
        for (int q=0; q<channels; q++)
        {
            const float* ptr = bottom_top_blob.channel(q);
            float* maxptr = max.row(q);

            for (int i=0; i<h; i++)
            {
                float max = -FLT_MAX;
                for (int j=0; j<w; j++)
                {
                    max = std::max(max, ptr[j]);
                }

                maxptr[i] = max;
                ptr += w;
            }
        }

        #pragma omp parallel for num_threads(opt.num_threads)
        for (int q=0; q<channels; q++)
        {
            float* ptr = bottom_top_blob.channel(q);
            float* maxptr = max.row(q);

            for (int i=0; i<h; i++)
            {
                float max = maxptr[i];
                for (int j=0; j<w; j++)
                {
                    ptr[j] = exp(ptr[j] - max);
                }

                ptr += w;
            }
        }

        Mat sum;
        sum.create(h, channels, elemsize, opt.workspace_allocator);
        if (sum.empty())
            return -100;
        sum.fill(0.f);
        #pragma omp parallel for num_threads(opt.num_threads)
        for (int q=0; q<channels; q++)
        {
            const float* ptr = bottom_top_blob.channel(q);
            float* sumptr = sum.row(q);

            for (int i=0; i<h; i++)
            {
                float sum = 0.f;
                for (int j=0; j<w; j++)
                {
                    sum += ptr[j];
                }

                sumptr[i] = sum;
                ptr += w;
            }
        }

        #pragma omp parallel for num_threads(opt.num_threads)
        for (int q=0; q<channels; q++)
        {
            float* ptr = bottom_top_blob.channel(q);
            float* sumptr = sum.row(q);

            for (int i=0; i<h; i++)
            {
                float sum = sumptr[i];
                for (int j=0; j<w; j++)
                {
                    ptr[j] /= sum;
                }

                ptr += w;
            }
        }

        return 0;
    }

    if (dims == 3 && axis == 2)
    {
        int w = bottom_top_blob.w;
        int h = bottom_top_blob.h;
        int channels = bottom_top_blob.c;

        Mat max;
        max.create(w, channels, elemsize, opt.workspace_allocator);
        if (max.empty())
            return -100;
        max.fill(-FLT_MAX);
        #pragma omp parallel for num_threads(opt.num_threads)
        for (int q=0; q<channels; q++)
        {
            const float* ptr = bottom_top_blob.channel(q);
            float* maxptr = max.row(q);

            for (int i=0; i<h; i++)
            {
                for (int j=0; j<w; j++)
                {
                    maxptr[j] = std::max(maxptr[j], ptr[j]);
                }

                ptr += w;
            }
        }

        #pragma omp parallel for num_threads(opt.num_threads)
        for (int q=0; q<channels; q++)
        {
            float* ptr = bottom_top_blob.channel(q);
            float* maxptr = max.row(q);

            for (int i=0; i<h; i++)
            {
                for (int j=0; j<w; j++)
                {
                    ptr[j] = exp(ptr[j] - maxptr[j]);
                }

                ptr += w;
            }
        }

        Mat sum;
        sum.create(w, channels, elemsize, opt.workspace_allocator);
        if (sum.empty())
            return -100;
        sum.fill(0.f);
        #pragma omp parallel for num_threads(opt.num_threads)
        for (int q=0; q<channels; q++)
        {
            const float* ptr = bottom_top_blob.channel(q);
            float* sumptr = sum.row(q);

            for (int i=0; i<h; i++)
            {
                for (int j=0; j<w; j++)
                {
                    sumptr[j] += ptr[j];
                }

                ptr += w;
            }
        }

        #pragma omp parallel for num_threads(opt.num_threads)
        for (int q=0; q<channels; q++)
        {
            float* ptr = bottom_top_blob.channel(q);
            float* sumptr = sum.row(q);

            for (int i=0; i<h; i++)
            {
                for (int j=0; j<w; j++)
                {
                    ptr[j] /= sumptr[j];
                }

                ptr += w;
            }
        }

        return 0;
    }

    return 0;
}